

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O3

bool __thiscall cmDocumentation::PrintRequestedDocumentation(cmDocumentation *this,ostream *os)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  bool bVar3;
  pointer pRVar4;
  ostream *os_00;
  int iVar5;
  int iVar6;
  ofstream fout;
  bool local_24c;
  undefined1 local_230 [248];
  ios_base local_138 [264];
  
  uVar2 = _vtable;
  pp_Var1 = _VTT;
  pRVar4 = (this->RequestedHelpItems).
           super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar4 == (this->RequestedHelpItems).
                super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_24c = true;
  }
  else {
    local_24c = true;
    iVar6 = 0;
    do {
      std::__cxx11::string::_M_assign((string *)&this->CurrentArgument);
      std::ofstream::ofstream((ostream *)local_230);
      if ((pRVar4->Filename)._M_string_length == 0) {
        iVar5 = iVar6 + 1;
        bVar3 = 0 < iVar6;
        os_00 = os;
        iVar6 = iVar5;
        if (bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n\n",2);
        }
      }
      else {
        std::ofstream::open((char *)local_230,(_Ios_Openmode)(pRVar4->Filename)._M_dataplus._M_p);
        os_00 = (ostream *)local_230;
      }
      bVar3 = PrintDocumentation(this,pRVar4->HelpType,os_00);
      if ((!bVar3) || (((&os_00->field_0x20)[(long)os_00->_vptr_basic_ostream[-3]] & 5) != 0)) {
        local_24c = false;
      }
      local_230._0_8_ = pp_Var1;
      *(undefined8 *)(local_230 + (long)pp_Var1[-3]) = uVar2;
      std::filebuf::~filebuf((filebuf *)(local_230 + 8));
      std::ios_base::~ios_base(local_138);
      pRVar4 = pRVar4 + 1;
    } while (pRVar4 != (this->RequestedHelpItems).
                       super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return local_24c;
}

Assistant:

bool cmDocumentation::PrintRequestedDocumentation(std::ostream& os)
{
  int count = 0;
  bool result = true;

  // Loop over requested documentation types.
  for (std::vector<RequestedHelpItem>::const_iterator i =
         this->RequestedHelpItems.begin();
       i != this->RequestedHelpItems.end(); ++i) {
    this->CurrentArgument = i->Argument;
    // If a file name was given, use it.  Otherwise, default to the
    // given stream.
    cmsys::ofstream fout;
    std::ostream* s = &os;
    if (!i->Filename.empty()) {
      fout.open(i->Filename.c_str());
      s = &fout;
    } else if (++count > 1) {
      os << "\n\n";
    }

    // Print this documentation type to the stream.
    if (!this->PrintDocumentation(i->HelpType, *s) || s->fail()) {
      result = false;
    }
  }
  return result;
}